

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

XMLCh * __thiscall
PSVIWriterHandlers::translateOrderedFacet(PSVIWriterHandlers *this,ORDERING ordered)

{
  ORDERING ordered_local;
  PSVIWriterHandlers *this_local;
  
  if (ordered == ORDERED_FALSE) {
    this_local = (PSVIWriterHandlers *)&xercesc_4_0::PSVIUni::fgFalse;
  }
  else if (ordered == ORDERED_PARTIAL) {
    this_local = (PSVIWriterHandlers *)&xercesc_4_0::PSVIUni::fgPartial;
  }
  else if (ordered == ORDERED_TOTAL) {
    this_local = (PSVIWriterHandlers *)&xercesc_4_0::PSVIUni::fgTotal;
  }
  else {
    this_local = (PSVIWriterHandlers *)&xercesc_4_0::PSVIUni::fgUnknown;
  }
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh* PSVIWriterHandlers::translateOrderedFacet(XSSimpleTypeDefinition::ORDERING ordered) {
	switch (ordered) {
		case XSSimpleTypeDefinition::ORDERED_FALSE:
			return PSVIUni::fgFalse;
		case XSSimpleTypeDefinition::ORDERED_PARTIAL:
			return PSVIUni::fgPartial;
		case XSSimpleTypeDefinition::ORDERED_TOTAL:
			return PSVIUni::fgTotal;
		default :
			return PSVIUni::fgUnknown;
	}
}